

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O3

void learn_sup_adf<true>(warm_cb *data,example *ec,int ec_type)

{
  uint64_t *puVar1;
  label_t *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  int iVar5;
  label *plVar6;
  example *peVar7;
  pointer ppeVar8;
  label_t lVar9;
  label_t lVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  multi_learner *pmVar15;
  pointer ppeVar16;
  ulong uVar17;
  wclass *pwVar18;
  float *__args;
  multi_ex *__range1;
  float fVar19;
  float fVar20;
  vector<float,_std::allocator<float>_> old_weights;
  void *local_48;
  iterator iStack_40;
  float *local_38;
  
  copy_example_to_adf(data,ec);
  if (data->num_actions != 0) {
    uVar17 = 0;
    do {
      uVar13 = uVar17 + 1;
      (data->csls[uVar17].costs._begin)->class_index = (uint32_t)uVar13;
      fVar19 = 0.0;
      for (pwVar18 = (ec->l).cs.costs._begin; pwVar18 != (ec->l).cs.costs._end;
          pwVar18 = pwVar18 + 1) {
        if (pwVar18->class_index == (uint32_t)uVar13) {
          fVar19 = pwVar18->x;
          break;
        }
      }
      (data->csls[uVar17].costs._begin)->x = (data->loss1 - data->loss0) * fVar19 + data->loss0;
      uVar17 = uVar13;
    } while (uVar13 < data->num_actions);
    if (data->num_actions != 0) {
      lVar14 = 0;
      uVar17 = 0;
      do {
        plVar6 = data->cbls;
        peVar7 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
        lVar9 = (peVar7->l).multi;
        lVar10 = *(label_t *)&(peVar7->l).cs.costs._end;
        sVar11 = (peVar7->l).cs.costs.erase_count;
        puVar3 = (undefined8 *)((long)&(plVar6->costs).end_array + lVar14);
        *puVar3 = (peVar7->l).cs.costs.end_array;
        puVar3[1] = sVar11;
        plVar2 = (label_t *)((long)&(plVar6->costs)._begin + lVar14);
        *plVar2 = lVar9;
        plVar2[1] = lVar10;
        peVar7 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
        plVar2 = (label_t *)((long)&(data->csls->costs)._begin + lVar14);
        lVar9 = *plVar2;
        lVar10 = plVar2[1];
        puVar3 = (undefined8 *)((long)&(data->csls->costs).end_array + lVar14);
        sVar11 = puVar3[1];
        (peVar7->l).cs.costs.end_array = (wclass *)*puVar3;
        (peVar7->l).cs.costs.erase_count = sVar11;
        (peVar7->l).multi = lVar9;
        *(label_t *)&(peVar7->l).cs.costs._end = lVar10;
        uVar17 = uVar17 + 1;
        lVar14 = lVar14 + 0x20;
      } while (uVar17 < data->num_actions);
      local_48 = (void *)0x0;
      iStack_40._M_current = (float *)0x0;
      local_38 = (float *)0x0;
      if (data->num_actions != 0) {
        uVar17 = 0;
        do {
          __args = &(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar17]->weight;
          if (iStack_40._M_current == local_38) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_48,iStack_40,__args);
          }
          else {
            *iStack_40._M_current = *__args;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
          uVar17 = uVar17 + 1;
          uVar12 = data->num_actions;
        } while (uVar17 < uVar12);
        goto LAB_001ef14e;
      }
    }
  }
  local_38 = (float *)0x0;
  iStack_40._M_current = (float *)0x0;
  local_48 = (void *)0x0;
  uVar12 = 0;
LAB_001ef14e:
  if (data->choices_lambda != 0) {
    uVar17 = 0;
    do {
      uVar12 = data->ws_train_size;
      uVar4 = data->inter_period;
      fVar19 = (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      fVar20 = 1.0 - fVar19;
      if (ec_type != 1) {
        fVar20 = fVar19;
      }
      if (data->num_actions != 0) {
        uVar13 = 0;
        do {
          (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13]->weight =
               *(float *)((long)local_48 + uVar13 * 4) *
               ((((float)uVar12 + (float)uVar4) * fVar20) /
               ((1.0 - fVar19) * (float)uVar12 + fVar19 * (float)uVar4 + 1.1754944e-38));
          uVar13 = uVar13 + 1;
        } while (uVar13 < data->num_actions);
      }
      pmVar15 = LEARNER::as_multiline<char,char>(data->all->cost_sensitive);
      ppeVar16 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppeVar8 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppeVar16 != ppeVar8) {
        iVar5 = *(int *)(pmVar15 + 0xe0);
        do {
          puVar1 = &((*ppeVar16)->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(iVar5 * (int)uVar17);
          ppeVar16 = ppeVar16 + 1;
        } while (ppeVar16 != ppeVar8);
      }
      (**(code **)(pmVar15 + 0x28))
                (*(undefined8 *)(pmVar15 + 0x18),*(undefined8 *)(pmVar15 + 0x20),&data->ecs);
      ppeVar16 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppeVar8 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppeVar16 != ppeVar8) {
        iVar5 = *(int *)(pmVar15 + 0xe0);
        do {
          puVar1 = &((*ppeVar16)->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(iVar5 * (int)uVar17);
          ppeVar16 = ppeVar16 + 1;
        } while (ppeVar16 != ppeVar8);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < data->choices_lambda);
    uVar12 = data->num_actions;
  }
  if (uVar12 != 0) {
    uVar17 = 0;
    do {
      (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17]->weight = *(float *)((long)local_48 + uVar17 * 4);
      uVar17 = uVar17 + 1;
    } while (uVar17 < data->num_actions);
    if (data->num_actions != 0) {
      lVar14 = 0;
      uVar17 = 0;
      do {
        peVar7 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
        plVar2 = (label_t *)((long)&(data->cbls->costs)._begin + lVar14);
        lVar9 = *plVar2;
        lVar10 = plVar2[1];
        puVar3 = (undefined8 *)((long)&(data->cbls->costs).end_array + lVar14);
        sVar11 = puVar3[1];
        (peVar7->l).cs.costs.end_array = (wclass *)*puVar3;
        (peVar7->l).cs.costs.erase_count = sVar11;
        (peVar7->l).multi = lVar9;
        *(label_t *)&(peVar7->l).cs.costs._end = lVar10;
        uVar17 = uVar17 + 1;
        lVar14 = lVar14 + 0x20;
      } while (uVar17 < data->num_actions);
    }
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void learn_sup_adf(warm_cb& data, example& ec, int ec_type)
{
	copy_example_to_adf(data, ec);
	//generate cost-sensitive label (for cost-sensitive learner's temporary use)
	auto& csls = data.csls;
	auto& cbls = data.cbls;
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		csls[a].costs[0].class_index = a+1;
		if (use_cs)
			csls[a].costs[0].x = loss_cs(data, ec.l.cs.costs, a+1);
 		else
			csls[a].costs[0].x = loss(data, ec.l.multi.label, a+1);
	}
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		cbls[a] = data.ecs[a]->l.cb;
		data.ecs[a]->l.cs = csls[a];
	}

	vector<float> old_weights;
	for (size_t a = 0; a < data.num_actions; ++a)
		old_weights.push_back(data.ecs[a]->weight);

	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		float weight_multiplier = compute_weight_multiplier(data, i, ec_type);
		for (size_t a = 0; a < data.num_actions; ++a)
			data.ecs[a]->weight = old_weights[a] * weight_multiplier;
		multi_learner* cs_learner = as_multiline(data.all->cost_sensitive);
		cs_learner->learn(data.ecs, i);
	}

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->weight = old_weights[a];

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->l.cb = cbls[a];
}